

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> * __thiscall
soul::heart::Parser::
parseOptionalBranchArgs<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul>>
          (ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>
           *__return_storage_ptr__,Parser *this,FunctionParseState *state)

{
  bool bVar1;
  pool_ref<soul::heart::Expression> local_30;
  
  __return_storage_ptr__->items = (pool_ref<soul::heart::Expression> *)__return_storage_ptr__->space
  ;
  __return_storage_ptr__->numActive = 0;
  __return_storage_ptr__->numAllocated = 4;
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x2c8be9);
  if (bVar1) {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x2c67cb);
    if (!bVar1) {
      do {
        local_30.object = parseExpression(this,state);
        ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::push_back
                  (__return_storage_ptr__,&local_30);
        bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x2a3519);
      } while (bVar1);
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x2c67cb);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ArgListType parseOptionalBranchArgs (const FunctionParseState& state)
    {
        heart::FunctionCall::ArgListType args;

        if (matchIf (HEARTOperator::openParen))
        {
            if (! matchIf (HEARTOperator::closeParen))
            {
                for (;;)
                {
                    auto& arg = parseExpression (state);
                    args.push_back (arg);

                    if (matchIf (HEARTOperator::comma))
                        continue;

                    expect (HEARTOperator::closeParen);
                    break;
                }
            }
        }

        return args;
    }